

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluVerify3(word *pF,int nVars,If_Grp_t *g,If_Grp_t *g2,If_Grp_t *r,word BStruth,
                  word BStruth2,word FStruth)

{
  int iVar1;
  int iStack_1203c;
  int i;
  word pTTRes [1024];
  word pTTWire2 [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word BStruth_local;
  If_Grp_t *r_local;
  If_Grp_t *g2_local;
  If_Grp_t *g_local;
  int nVars_local;
  word *pF_local;
  
  pTTFans[5][0x3ff] = BStruth;
  if (((g->nVars < '\x02') || (g2->nVars < '\x02')) || (r->nVars < '\x02')) {
    __assert_fail("g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a5,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  if (((g->nVars < '\a') && (g2->nVars < '\a')) && (r->nVars < '\a')) {
    if (TruthAll[0][0] == 0) {
      If_CluInitTruthTables();
    }
    for (iStack_1203c = 0; iStack_1203c < g->nVars; iStack_1203c = iStack_1203c + 1) {
      If_CluCopy(pTTFans[(long)iStack_1203c + -1] + 0x3ff,TruthAll[(int)g->pVars[iStack_1203c]],
                 nVars);
    }
    If_CluComposeLut(nVars,g,pTTFans[5] + 0x3ff,(word (*) [1024])(pTTWire + 0x3ff),pTTWire2 + 0x3ff)
    ;
    for (iStack_1203c = 0; iStack_1203c < g2->nVars; iStack_1203c = iStack_1203c + 1) {
      If_CluCopy(pTTFans[(long)iStack_1203c + -1] + 0x3ff,TruthAll[(int)g2->pVars[iStack_1203c]],
                 nVars);
    }
    If_CluComposeLut(nVars,g2,&BStruth2,(word (*) [1024])(pTTWire + 0x3ff),pTTRes + 0x3ff);
    for (iStack_1203c = 0; iStack_1203c < r->nVars; iStack_1203c = iStack_1203c + 1) {
      if (r->pVars[iStack_1203c] == nVars) {
        If_CluCopy(pTTFans[(long)iStack_1203c + -1] + 0x3ff,pTTWire2 + 0x3ff,nVars);
      }
      else if ((int)r->pVars[iStack_1203c] == nVars + 1) {
        If_CluCopy(pTTFans[(long)iStack_1203c + -1] + 0x3ff,pTTRes + 0x3ff,nVars);
      }
      else {
        If_CluCopy(pTTFans[(long)iStack_1203c + -1] + 0x3ff,TruthAll[(int)r->pVars[iStack_1203c]],
                   nVars);
      }
    }
    If_CluComposeLut(nVars,r,&FStruth,(word (*) [1024])(pTTWire + 0x3ff),
                     (word *)&stack0xfffffffffffedfc8);
    iVar1 = If_CluEqual((word *)&stack0xfffffffffffedfc8,pF,nVars);
    if (iVar1 == 0) {
      printf("%d\n",(ulong)(uint)nVars);
      Kit_DsdPrintFromTruth((uint *)(pTTFans[5] + 0x3ff),(int)g->nVars);
      printf("    ");
      If_CluPrintGroup(g);
      Kit_DsdPrintFromTruth((uint *)&BStruth2,(int)g2->nVars);
      printf("    ");
      If_CluPrintGroup(g2);
      Kit_DsdPrintFromTruth((uint *)&FStruth,(int)r->nVars);
      printf("    ");
      If_CluPrintGroup(r);
      Kit_DsdPrintFromTruth((uint *)(pTTWire2 + 0x3ff),nVars);
      printf("\n");
      Kit_DsdPrintFromTruth((uint *)(pTTRes + 0x3ff),nVars);
      printf("\n");
      Kit_DsdPrintFromTruth((uint *)&stack0xfffffffffffedfc8,nVars);
      printf("\n");
      Kit_DsdPrintFromTruth((uint *)pF,nVars);
      printf("\n");
      printf("Verification FAILED!\n");
    }
    return;
  }
  __assert_fail("g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x2a6,
                "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
               );
}

Assistant:

void If_CluVerify3( word * pF, int nVars, If_Grp_t * g, If_Grp_t * g2, If_Grp_t * r, word BStruth, word BStruth2, word FStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTWire2[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2 );
    assert( g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < g2->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g2->pVars[i]], nVars );
    If_CluComposeLut( nVars, g2, &BStruth2, pTTFans, pTTWire2 );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else if ( r->pVars[i] == nVars + 1 )
            If_CluCopy( pTTFans[i], pTTWire2, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, &FStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "%d\n", nVars );
//        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)&BStruth, g->nVars );   printf( "    " ); If_CluPrintGroup(g);  // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&BStruth2, g2->nVars ); printf( "    " ); If_CluPrintGroup(g2); // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&FStruth, r->nVars );   printf( "    " ); If_CluPrintGroup(r);  // printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)pTTWire, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTWire2, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}